

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

string * __thiscall
cs_impl::cxx_demangle_abi_cxx11_(string *__return_storage_ptr__,cs_impl *this,char *name)

{
  char *__s;
  size_t sVar1;
  int status;
  size_t size;
  char buffer [1024];
  allocator local_425;
  undefined1 local_424 [4];
  undefined8 local_420;
  undefined1 local_418 [1024];
  
  memset(local_418,0,0x400);
  local_420 = 0x400;
  __s = (char *)__cxa_demangle(this,local_418,&local_420,local_424);
  if (__s == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_425);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cxx_demangle(const char *name)
	{
		char buffer[1024] = {0};
		size_t size = sizeof(buffer);
		int status;
		char *ret = abi::__cxa_demangle(name, buffer, &size, &status);
		if (ret != nullptr)
			return std::string(ret);
		else
			return name;
	}